

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_get_in_many(planck_unit_test_t *tc)

{
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  ion_dictionary_t local_78;
  ion_dictionary_handler_t local_60;
  
  bhdct_setup(tc,&local_60,&local_78,ion_fill_none);
  local_7c = 0x23;
  local_80 = 0x46;
  bhdct_insert(tc,&local_78,&local_7c,&local_80,'\x01');
  local_84 = 0x3ea;
  local_88 = 0x7d4;
  bhdct_insert(tc,&local_78,&local_84,&local_88,'\x01');
  local_8c = 0x37;
  local_90 = 0x6e;
  bhdct_insert(tc,&local_78,&local_8c,&local_90,'\x01');
  local_94 = 0xfffffffb;
  local_98 = 0xfffffff6;
  bhdct_insert(tc,&local_78,&local_94,&local_98,'\x01');
  bhdct_delete_dictionary(tc,&local_78);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_in_many(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	bhdct_insert(tc, &dict, IONIZE(35, int), IONIZE(35 * 2, int), boolean_true);
	bhdct_insert(tc, &dict, IONIZE(1002, int), IONIZE(1002 * 2, int), boolean_true);
	bhdct_insert(tc, &dict, IONIZE(55, int), IONIZE(55 * 2, int), boolean_true);
	bhdct_insert(tc, &dict, IONIZE(-5, int), IONIZE(-5 * 2, int), boolean_true);

	bhdct_takedown(tc, &dict);
}